

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O1

void __thiscall
backend::codegen::RegAllocator::replace_write(RegAllocator *this,ReplaceWriteAction r,int i)

{
  Reg *pRVar1;
  ConditionCode CVar2;
  pointer puVar3;
  Inst *pIVar4;
  uint uVar5;
  undefined4 r_00;
  undefined4 uVar6;
  bool bVar7;
  undefined7 extraout_var;
  tuple<arm::Inst_*,_std::default_delete<arm::Inst>_> tVar8;
  ostream *poVar9;
  _func_int **pp_Var10;
  char *pcVar11;
  Tag *pTVar12;
  MemoryOperand *this_00;
  pointer __p;
  ulong uVar13;
  __hashtable *__h;
  anon_class_16_2_94732020 disp_reg;
  ostream local_149;
  __uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_> local_148;
  size_type local_140;
  undefined1 local_138;
  undefined7 uStack_137;
  undefined8 uStack_130;
  anon_class_8_1_a78179b7_conflict10 local_128;
  Displayable local_120;
  _Variadic_union<arm::RegisterOperand,_short> local_118;
  int local_104;
  undefined **local_100;
  undefined8 local_f8;
  _Variadic_union<arm::RegisterOperand,_short> local_f0;
  undefined1 local_e0;
  bool local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  _Head_base<0UL,_arm::Inst_*,_false> local_98;
  size_type local_90;
  undefined1 local_88 [16];
  size_t local_78;
  bool local_70;
  anon_class_16_2_94732020 local_68;
  _Head_base<0UL,_arm::LoadStoreInst_*,_false> local_58;
  undefined8 local_50;
  undefined1 local_48;
  ulong local_40;
  int local_34;
  
  local_d0._8_4_ = r.kind;
  pp_Var10 = r._0_8_;
  local_68.r = (ReplaceWriteAction *)local_d0;
  pTVar12 = (Tag *)&local_34;
  local_d0._4_4_ = r.replace_with;
  uVar6 = local_d0._4_4_;
  local_d0._0_8_ = pp_Var10;
  local_68.i = (int *)pTVar12;
  local_34 = i;
  if (local_d0._8_4_ != Spill) {
    if (local_d0._8_4_ == Graph) {
      replace_write::anon_class_16_2_94732020::operator()(&local_68);
      local_149 = (ostream)0x0;
      AixLog::operator<<(&local_149,(Severity *)pTVar12);
      local_f8 = &local_f0._M_first._M_storage.reg;
      local_100 = &PTR__Tag_001edee0;
      local_f0._M_first._M_storage.super_Displayable._vptr_Displayable =
           (Displayable)(_func_int **)0x0;
      local_f0._M_first._M_storage.reg._0_1_ = 0;
      local_d8 = true;
      AixLog::operator<<((ostream *)&local_100,pTVar12);
      local_50 = std::chrono::_V2::system_clock::now();
      local_58._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
      local_48 = 0;
      AixLog::operator<<((ostream *)&local_58,(Timestamp *)pTVar12);
      local_128.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"replace_write","");
      pcVar11 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,"");
      local_c0._0_4_ = 0x1edf10;
      local_c0._4_4_ = 0;
      local_c0._8_8_ = local_128.__lhs;
      if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128.__lhs == &local_118) {
        _uStack_a0 = local_118._8_8_;
        local_c0._8_8_ = (_Variadic_union<arm::RegisterOperand,_short> *)(local_b0 + 8);
      }
      local_98._M_head_impl = (Inst *)local_88;
      local_b0._0_8_ = local_120._vptr_Displayable;
      local_120._vptr_Displayable = (_func_int **)0x0;
      local_118._M_rest._M_first._M_storage._0_1_ = 0;
      if (local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl ==
          (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138) {
        local_88._8_8_ = uStack_130;
      }
      else {
        local_98._M_head_impl =
             (Inst *)local_148._M_t.
                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      }
      local_90 = local_140;
      local_140 = 0;
      local_138 = 0;
      local_78 = 0x2fd;
      local_70 = false;
      local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138;
      local_128.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_118;
      AixLog::operator<<((ostream *)local_c0,(Function *)pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"graph",5);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    else if (local_d0._8_4_ == Phys) {
      pTVar12 = (Tag *)local_c0;
      local_c0._0_4_ = local_d0._4_4_;
      local_c0._8_4_ = 0xffffffff;
      local_c0._4_4_ = i;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->active);
      replace_write::anon_class_16_2_94732020::operator()(&local_68);
      local_149 = (ostream)0x0;
      AixLog::operator<<(&local_149,(Severity *)pTVar12);
      local_f8 = &local_f0._M_first._M_storage.reg;
      local_100 = &PTR__Tag_001edee0;
      local_f0._M_first._M_storage.super_Displayable._vptr_Displayable =
           (Displayable)(_func_int **)0x0;
      local_f0._M_first._M_storage.reg._0_1_ = 0;
      local_d8 = true;
      AixLog::operator<<((ostream *)&local_100,pTVar12);
      local_50 = std::chrono::_V2::system_clock::now();
      local_58._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
      local_48 = 0;
      AixLog::operator<<((ostream *)&local_58,(Timestamp *)pTVar12);
      local_128.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"replace_write","");
      pcVar11 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,"");
      local_c0._0_4_ = 0x1edf10;
      local_c0._4_4_ = 0;
      local_c0._8_8_ = local_128.__lhs;
      if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128.__lhs == &local_118) {
        _uStack_a0 = local_118._8_8_;
        local_c0._8_8_ = (_Variadic_union<arm::RegisterOperand,_short> *)(local_b0 + 8);
      }
      local_98._M_head_impl = (Inst *)local_88;
      local_b0._0_8_ = local_120._vptr_Displayable;
      local_120._vptr_Displayable = (_func_int **)0x0;
      local_118._M_rest._M_first._M_storage._0_1_ = 0;
      if (local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl ==
          (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138) {
        local_88._8_8_ = uStack_130;
      }
      else {
        local_98._M_head_impl =
             (Inst *)local_148._M_t.
                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      }
      local_90 = local_140;
      local_140 = 0;
      local_138 = 0;
      local_78 = 0x2f8;
      local_70 = false;
      local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138;
      local_128.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_118;
      AixLog::operator<<((ostream *)local_c0,(Function *)pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"phys ",5);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    else {
      replace_write::anon_class_16_2_94732020::operator()(&local_68);
      local_149 = (ostream)0x0;
      AixLog::operator<<(&local_149,(Severity *)pTVar12);
      local_f8 = &local_f0._M_first._M_storage.reg;
      local_100 = &PTR__Tag_001edee0;
      local_f0._M_first._M_storage.super_Displayable._vptr_Displayable =
           (Displayable)(_func_int **)0x0;
      local_f0._M_first._M_storage.reg._0_1_ = 0;
      local_d8 = true;
      AixLog::operator<<((ostream *)&local_100,pTVar12);
      local_50 = std::chrono::_V2::system_clock::now();
      local_58._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
      local_48 = 0;
      AixLog::operator<<((ostream *)&local_58,(Timestamp *)pTVar12);
      local_128.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"replace_write","");
      pcVar11 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,"");
      local_c0._0_4_ = 0x1edf10;
      local_c0._4_4_ = 0;
      local_c0._8_8_ = local_128.__lhs;
      if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128.__lhs == &local_118) {
        _uStack_a0 = local_118._8_8_;
        local_c0._8_8_ = (_Variadic_union<arm::RegisterOperand,_short> *)(local_b0 + 8);
      }
      local_98._M_head_impl = (Inst *)local_88;
      local_b0._0_8_ = local_120._vptr_Displayable;
      local_120._vptr_Displayable = (_func_int **)0x0;
      local_118._M_rest._M_first._M_storage._0_1_ = 0;
      if (local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl ==
          (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138) {
        local_88._8_8_ = uStack_130;
      }
      else {
        local_98._M_head_impl =
             (Inst *)local_148._M_t.
                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      }
      local_90 = local_140;
      local_140 = 0;
      local_138 = 0;
      local_78 = 0x319;
      local_70 = false;
      local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138;
      local_128.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_118;
      AixLog::operator<<((ostream *)local_c0,(Function *)pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"temp",4);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    AixLog::Function::~Function((Function *)local_c0);
    if (local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
        super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl !=
        (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138) {
      operator_delete((void *)local_148._M_t.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
                      CONCAT71(uStack_137,local_138) + 1);
    }
    if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128.__lhs != &local_118) {
      operator_delete(local_128.__lhs,
                      CONCAT71(local_118._1_7_,local_118._M_rest._M_first._M_storage._0_1_) + 1);
    }
    if (local_f8 == &local_f0._M_first._M_storage.reg) {
      return;
    }
    goto LAB_0017aca8;
  }
  local_d0._0_4_ = r.from;
  r_00 = local_d0._0_4_;
  local_104 = get_or_alloc_spill_pos(this,r_00);
  puVar3 = (this->inst_sink).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 == (this->inst_sink).
                super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
LAB_0017a777:
    uVar13 = 0;
  }
  else {
    pIVar4 = puVar3[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    uVar13 = 0;
    if ((pIVar4->super_Displayable)._vptr_Displayable == (_func_int **)&PTR_display_001f09c8) {
      this_00 = (MemoryOperand *)0x0;
      if ((char)pIVar4[4].op == B) {
        this_00 = (MemoryOperand *)&pIVar4[1].op;
      }
      if (((pIVar4->op != StR) || (this_00->r1 != uVar6)) || (pIVar4->cond != this->cur_cond))
      goto LAB_0017a777;
      local_c0._0_4_ = 0x1f0808;
      local_c0._4_4_ = 0;
      local_c0._8_4_ = local_c0._8_4_ & 0xffffff00;
      local_c0._12_4_ = 0xd;
      local_b0._0_2_ = (short)this->stack_offset + (short)local_104;
      uStack_a0 = 1;
      bVar7 = arm::MemoryOperand::operator==(this_00,(MemoryOperand *)local_c0);
      uVar13 = CONCAT71(extraout_var,bVar7) & 0xffffffff;
    }
  }
  if ((char)uVar13 == '\0') {
    local_100 = &PTR_display_001f0808;
    uVar5 = (uint)local_f8;
    local_f8 = (Reg *)CONCAT44(0xd,uVar5 & 0xffffff00);
    local_f0._M_rest = (_Variadic_union<short>)((short)this->stack_offset + (short)local_104);
    local_e0 = 1;
    local_40 = uVar13;
    tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x50);
    local_c0._0_4_ = 0x1f0808;
    local_c0._4_4_ = 0;
    local_c0._8_4_ = SUB84(local_f8,0);
    local_c0._12_4_ = (undefined4)((ulong)local_f8 >> 0x20);
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_short>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_short> *)local_b0,
               (_Move_ctor_base<false,_arm::RegisterOperand,_short> *)&local_f0._M_first);
    local_98._M_head_impl._0_1_ = local_d8;
    CVar2 = this->cur_cond;
    *(undefined4 *)
     ((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = 0x1c;
    *(ConditionCode *)
     ((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = CVar2;
    *(undefined ***)
     tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f09c8;
    *(undefined4 *)
     ((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10) = uVar6;
    *(undefined ***)
     ((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0808;
    *(long *)((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20) =
         CONCAT44(local_c0._12_4_,local_c0._8_4_);
    local_128.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)
         ((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x28);
    *(undefined1 *)
     ((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x38) = 0xff;
    *(undefined1 *)
     ((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x38) = uStack_a0;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_short>_&>
      ::_S_vtable._M_arr[(long)(char)uStack_a0 + 1]._M_data)
              (&local_128,(variant<arm::RegisterOperand,_short> *)local_b0);
    *(bool *)((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x40) =
         local_98._M_head_impl._0_1_;
    *(undefined1 *)
     ((long)tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x48) = 1;
    local_58._M_head_impl = (LoadStoreInst *)0x0;
    local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar8.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst_sink,
               (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_148);
    if ((_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)
        local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
        super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl != (Inst *)0x0) {
      (**(code **)(*(long *)local_148._M_t.
                            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))();
    }
    local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)0x0;
    std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
              ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)&local_58
              );
  }
  pTVar12 = (Tag *)local_d0;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->wrote_to)._M_h);
  replace_write::anon_class_16_2_94732020::operator()(&local_68);
  local_149 = (ostream)0x0;
  AixLog::operator<<(&local_149,(Severity *)pTVar12);
  pRVar1 = &local_f0._M_first._M_storage.reg;
  local_100 = &PTR__Tag_001edee0;
  local_f0._M_first._M_storage.super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0;
  local_f0._M_first._M_storage.reg._0_1_ = 0;
  local_d8 = true;
  local_f8 = pRVar1;
  AixLog::operator<<((ostream *)&local_100,pTVar12);
  local_50 = std::chrono::_V2::system_clock::now();
  local_58._M_head_impl = (LoadStoreInst *)&PTR__Timestamp_001edeb0;
  local_48 = 0;
  AixLog::operator<<((ostream *)&local_58,(Timestamp *)pTVar12);
  local_128.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"replace_write","");
  pcVar11 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
       (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
       (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  local_c0._0_4_ = 0x1edf10;
  local_c0._4_4_ = 0;
  local_c0._8_8_ = local_128.__lhs;
  if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128.__lhs == &local_118) {
    _uStack_a0 = local_118._8_8_;
    local_c0._8_8_ = (_Variadic_union<arm::RegisterOperand,_short> *)(local_b0 + 8);
  }
  local_98._M_head_impl = (Inst *)local_88;
  local_b0._0_8_ = local_120._vptr_Displayable;
  local_120._vptr_Displayable = (_func_int **)0x0;
  local_118._M_rest._M_first._M_storage._0_1_ = 0;
  if (local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl ==
      (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138) {
    local_88._8_8_ = uStack_130;
  }
  else {
    local_98._M_head_impl =
         (Inst *)local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                 .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
  }
  local_90 = local_140;
  local_140 = 0;
  local_138 = 0;
  local_78 = 0x316;
  local_70 = false;
  local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
       (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
       (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138;
  local_128.__lhs = (_Copy_ctor_base<false,_arm::RegisterOperand,_short> *)&local_118;
  AixLog::operator<<((ostream *)local_c0,(Function *)pcVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"spill ",6);
  poVar9 = (ostream *)std::ostream::operator<<(&std::clog,local_104);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_c0);
  if (local_148._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)&local_138) {
    operator_delete((void *)local_148._M_t.
                            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
                    CONCAT71(uStack_137,local_138) + 1);
  }
  if ((_Variadic_union<arm::RegisterOperand,_short> *)local_128.__lhs != &local_118) {
    operator_delete(local_128.__lhs,
                    CONCAT71(local_118._1_7_,local_118._M_rest._M_first._M_storage._0_1_) + 1);
  }
  if (local_f8 == pRVar1) {
    return;
  }
LAB_0017aca8:
  local_100 = &PTR__Tag_001edee0;
  operator_delete(local_f8,CONCAT71(local_f0._9_7_,local_f0._M_first._M_storage.reg._0_1_) + 1);
  return;
}

Assistant:

void RegAllocator::replace_write(ReplaceWriteAction r, int i) {
  auto disp_reg = [&]() {
    display_reg_name(LOG(TRACE), r.from);
    LOG(TRACE) << " at: " << i << " ";
  };
  if (r.kind == ReplaceWriteKind::Phys) {
    // is physical register; mark as occupied
    active.insert({r.replace_with, Interval(i, UINT32_MAX)});
    disp_reg();
    LOG(TRACE) << "phys " << r.replace_with << std::endl;
    return;
  } else if (r.kind == ReplaceWriteKind::Graph) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph" << std::endl;
  } else if (r.kind == ReplaceWriteKind::Spill) {
    // this register is allocated in stack
    Reg rd = r.replace_with;
    int pos = get_or_alloc_spill_pos(r.from);

    bool del = false;
    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x__->r1 == rd &&
            x_->cond == cur_cond &&
            (*x__) == MemoryOperand(REG_SP, pos + stack_offset)) {
          del = true;
        }
      }
    }
    if (!del) {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::StR, rd, MemoryOperand(REG_SP, pos + stack_offset),
          cur_cond));
    }
    wrote_to.erase(r.from);
    disp_reg();
    LOG(TRACE) << "spill " << pos << " " << del << std::endl;
  } else {
    disp_reg();
    LOG(TRACE) << "temp" << std::endl;
    // Is temporary register
    // the register should already be written to or read from

    // throw new std::logic_error("Writing to transient register");
  }
}